

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5TombstoneArrayDelete(Fts5TombstoneArray *p)

{
  int *in_RDI;
  int ii;
  int local_c;
  
  if ((in_RDI != (int *)0x0) && (*in_RDI = *in_RDI + -1, *in_RDI < 1)) {
    for (local_c = 0; local_c < in_RDI[1]; local_c = local_c + 1) {
      fts5DataRelease((Fts5Data *)0x26b819);
    }
    sqlite3_free((void *)0x26b830);
  }
  return;
}

Assistant:

static void fts5TombstoneArrayDelete(Fts5TombstoneArray *p){
  if( p ){
    p->nRef--;
    if( p->nRef<=0 ){
      int ii;
      for(ii=0; ii<p->nTombstone; ii++){
        fts5DataRelease(p->apTombstone[ii]);
      }
      sqlite3_free(p);
    }
  }
}